

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  reference pbVar5;
  size_type sVar6;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  path;
  duration<long,_std::ratio<1L,_1000L>_> local_250;
  rep local_248;
  rep ms;
  time_point time1;
  my_priority_queue agenda_2;
  my_queue agenda_1;
  stack<State,_std::deque<State,_std::allocator<State>_>_> agenda;
  set<State,_std::less<State>,_std::allocator<State>_> closedSet;
  State end;
  time_point time0;
  int local_110;
  int iterations;
  int algo;
  State local_e8;
  byte local_b9;
  int local_b8;
  int iStack_b4;
  bool ok;
  int height;
  int width;
  int aiStack_88 [2];
  int numbers [9];
  undefined1 local_58 [8];
  State start;
  string in;
  
  std::__cxx11::string::string((string *)&start.previous);
  State::State((State *)local_58);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "Do you want to generate a random configuration? (Y/n)");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::operator<<(poVar3,"If not, the project\'s default one will be used: ");
  std::operator>>((istream *)&std::cin,(string *)&start.previous);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&start.previous);
  iVar2 = tolower((int)*pcVar4);
  if (iVar2 == 0x6e) {
    numbers[2] = 3;
    numbers[3] = 2;
    numbers[4] = 8;
    numbers[5] = 5;
    aiStack_88[0] = 6;
    aiStack_88[1] = 7;
    numbers[0] = 1;
    numbers[1] = 0;
    numbers[6] = 4;
    State::State((State *)&height,3,3,aiStack_88);
    State::operator=((State *)local_58,(State *)&height);
    State::~State((State *)&height);
LAB_00102884:
    poVar3 = std::operator<<((ostream *)&std::cout,"Select algorithm (1/2/3): ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"1) Depth First Search");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"2) Breadth First Search");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"3) Best First Search");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::istream::operator>>((istream *)&std::cin,&local_110);
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    end.previous = (State *)std::chrono::_V2::system_clock::now();
    State::State((State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
    std::set<State,_std::less<State>,_std::allocator<State>_>::set
              ((set<State,_std::less<State>,_std::allocator<State>_> *)
               &agenda.c.super__Deque_base<State,_std::allocator<State>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    if (local_110 == 1) {
      std::stack<State,std::deque<State,std::allocator<State>>>::
      stack<std::deque<State,std::allocator<State>>,void>
                ((stack<State,std::deque<State,std::allocator<State>>> *)
                 ((long)&agenda_1.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
                         super__Deque_base<State,_std::allocator<State>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18));
      std::stack<State,_std::deque<State,_std::allocator<State>_>_>::push
                ((stack<State,_std::deque<State,_std::allocator<State>_>_> *)
                 ((long)&agenda_1.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
                         super__Deque_base<State,_std::allocator<State>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18),(value_type *)local_58);
      time0.__d.__r._4_4_ =
           dfs((State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<State,_std::less<State>,_std::allocator<State>_> *)
               &agenda.c.super__Deque_base<State,_std::allocator<State>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,
               (stack<State,_std::deque<State,_std::allocator<State>_>_> *)
               ((long)&agenda_1.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
                       super__Deque_base<State,_std::allocator<State>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18));
      iterations = 4;
      std::stack<State,_std::deque<State,_std::allocator<State>_>_>::~stack
                ((stack<State,_std::deque<State,_std::allocator<State>_>_> *)
                 ((long)&agenda_1.super_queue<State,_std::deque<State,_std::allocator<State>_>_>.c.
                         super__Deque_base<State,_std::allocator<State>_>._M_impl.
                         super__Deque_impl_data._M_finish + 0x18));
    }
    else if (local_110 == 2) {
      my_queue::my_queue((my_queue *)
                         &agenda_2.
                          super_priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>
                          .field_0x18);
      std::queue<State,_std::deque<State,_std::allocator<State>_>_>::push
                ((queue<State,_std::deque<State,_std::allocator<State>_>_> *)
                 &agenda_2.
                  super_priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>
                  .field_0x18,(value_type *)local_58);
      time0.__d.__r._4_4_ =
           bfs((State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (set<State,_std::less<State>,_std::allocator<State>_> *)
               &agenda.c.super__Deque_base<State,_std::allocator<State>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node,
               (my_queue *)
               &agenda_2.
                super_priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>
                .field_0x18);
      iterations = 4;
      my_queue::~my_queue((my_queue *)
                          &agenda_2.
                           super_priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>
                           .field_0x18);
    }
    else {
      my_priority_queue::my_priority_queue((my_priority_queue *)&time1);
      std::priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates>::push
                ((priority_queue<State,_std::vector<State,_std::allocator<State>_>,_compareStates> *
                 )&time1,(value_type *)local_58);
      time0.__d.__r._4_4_ =
           bestfs((State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (set<State,_std::less<State>,_std::allocator<State>_> *)
                  &agenda.c.super__Deque_base<State,_std::allocator<State>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node,(my_priority_queue *)&time1);
      iterations = 4;
      my_priority_queue::~my_priority_queue((my_priority_queue *)&time1);
    }
    if (time0.__d.__r._4_4_ < 1) {
      poVar3 = std::operator<<((ostream *)&std::cout,"No solution!");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      ms = std::chrono::_V2::system_clock::now();
      path.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)std::chrono::operator-
                              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                *)&ms,(time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                       *)&end.previous);
      local_250.__r =
           (rep)std::chrono::
                duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                          ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                           &path.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_248 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_250);
      poVar3 = std::operator<<((ostream *)&std::cout,"Solution:");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      State::getPath_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__range2,(State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
      State::getPath_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&__begin2,(State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
      __end2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin2);
      s = (string *)
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin2);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&s), bVar1) {
        pbVar5 = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
        poVar3 = std::operator<<((ostream *)&std::cout,(string *)pbVar5);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end2);
      }
      iterations = 5;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin2);
      poVar3 = std::operator<<((ostream *)&std::cout,"Completed in ");
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&__range2);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6 - 1);
      poVar3 = std::operator<<(poVar3," steps.");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,time0.__d.__r._4_4_);
      poVar3 = std::operator<<(poVar3," iterations / ");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,local_248);
      poVar3 = std::operator<<(poVar3,"ms");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__range2);
    }
    iterations = 1;
    std::set<State,_std::less<State>,_std::allocator<State>_>::~set
              ((set<State,_std::less<State>,_std::allocator<State>_> *)
               &agenda.c.super__Deque_base<State,_std::allocator<State>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node);
    State::~State((State *)&closedSet._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    std::operator<<((ostream *)&std::cout,"Insert width: ");
    std::istream::operator>>((istream *)&std::cin,&stack0xffffffffffffff4c);
    std::operator<<((ostream *)&std::cout,"Insert height: ");
    std::istream::operator>>((istream *)&std::cin,&local_b8);
    local_b9 = 0;
    do {
      do {
        if (((local_b9 ^ 0xff) & 1) == 0) goto LAB_00102884;
        State::State(&local_e8,iStack_b4,local_b8);
        State::operator=((State *)local_58,&local_e8);
        State::~State(&local_e8);
        poVar3 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"Start: ");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        State::toString_abi_cxx11_((string *)&algo,(State *)local_58);
        poVar3 = std::operator<<(poVar3,(string *)&algo);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::~string((string *)&algo);
        local_b9 = State::isSolvable((State *)local_58);
      } while ((bool)local_b9);
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "Starting layout is not solvable! Try again? (Y/n)");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      std::operator>>((istream *)&std::cin,(string *)&start.previous);
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)&start.previous);
      iVar2 = tolower((int)*pcVar4);
    } while (iVar2 != 0x6e);
    iterations = 1;
  }
  State::~State((State *)local_58);
  std::__cxx11::string::~string((string *)&start.previous);
  return 0;
}

Assistant:

int main() {
    std::string in;
    State start;

    std::cout << "Do you want to generate a random configuration? (Y/n)" << std::endl
              << "If not, the project's default one will be used: ";
    std::cin >> in;

    if (std::tolower(in[0]) == 'n') {
        int numbers[] = {6, 7, 1, 0, 3, 2, 8, 5, 4};
        start = State(3, 3, numbers);
    } else {
        int width, height;
        std::cout << "Insert width: ";
        std::cin >> width;
        std::cout << "Insert height: ";
        std::cin >> height;

        bool ok = false;
        while (!ok) {
            start = State(width, height);
            std::cout << std::endl
                      << "Start: " << std::endl
                      << start.toString() << std::endl;

            ok = start.isSolvable();

            if (!ok) {
                std::cout << "Starting layout is not solvable! Try again? (Y/n)" << std::endl;
                std::cin >> in;

                if (std::tolower(in[0]) == 'n')
                    return 0;
            }
        }
    }

    int algo;
    std::cout << "Select algorithm (1/2/3): " << std::endl
              << "1) Depth First Search" << std::endl
              << "2) Breadth First Search" << std::endl
              << "3) Best First Search" << std::endl;
    std::cin >> algo;
    std::cout << std::endl;

    int iterations;
    auto time0 = std::chrono::high_resolution_clock::now();

    State end;
    std::set<State> closedSet;

    switch (algo) {
        case 1: {
            std::stack<State> agenda;
            agenda.push(start);
            iterations = dfs(end, closedSet, agenda);
            break;
        }

        case 2: {
            my_queue agenda;
            agenda.push(start);
            iterations = bfs(end, closedSet, agenda);
            break;
        }

        default: {
            my_priority_queue agenda;
            agenda.push(start);
            iterations = bestfs(end, closedSet, agenda);
            break;
        }
    }

    if (iterations > 0) {
        auto time1 = std::chrono::high_resolution_clock::now();
        auto ms = std::chrono::duration_cast<std::chrono::milliseconds>(time1 - time0).count();

        std::cout << "Solution:" << std::endl;
        std::vector<std::string> path = end.getPath();
        for (std::string &s : end.getPath()) {
            std::cout << s << std::endl;
        }

        std::cout << "Completed in " << path.size() - 1 << " steps." << std::endl
                  << iterations << " iterations / " << ms << "ms" << std::endl;
    } else {
        std::cout << "No solution!" << std::endl;
    }

    return 0;
}